

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxratiotester.h
# Opt level: O1

void __thiscall
soplex::
SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setDelta(SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newDelta)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  int iVar12;
  Real RVar13;
  cpp_dec_float<100U,_int,_void> local_78;
  
  pTVar1 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar13 = Tolerances::epsilon(pTVar1);
  bVar3 = false;
  if ((!NAN(RVar13)) && (bVar3 = false, (newDelta->m_backend).fpclass != cpp_dec_float_NaN)) {
    local_78.fpclass = cpp_dec_float_finite;
    local_78.prec_elem = 0x10;
    local_78.data._M_elems[0] = 0;
    local_78.data._M_elems[1] = 0;
    local_78.data._M_elems[2] = 0;
    local_78.data._M_elems[3] = 0;
    local_78.data._M_elems[4] = 0;
    local_78.data._M_elems[5] = 0;
    local_78.data._M_elems[6] = 0;
    local_78.data._M_elems[7] = 0;
    local_78.data._M_elems[8] = 0;
    local_78.data._M_elems[9] = 0;
    local_78.data._M_elems[10] = 0;
    local_78.data._M_elems[0xb] = 0;
    local_78.data._M_elems[0xc] = 0;
    local_78.data._M_elems[0xd] = 0;
    local_78.data._M_elems._56_5_ = 0;
    local_78.data._M_elems[0xf]._1_3_ = 0;
    local_78.exp = 0;
    local_78.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_78,RVar13);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&newDelta->m_backend,&local_78);
    bVar3 = iVar12 < 1;
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (bVar3) {
    pTVar1 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    RVar13 = Tolerances::epsilon(pTVar1);
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&this->delta,RVar13);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  else {
    uVar4 = *(undefined8 *)(newDelta->m_backend).data._M_elems;
    uVar5 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 2);
    uVar6 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 4);
    uVar7 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 6);
    uVar8 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 8);
    uVar9 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 10);
    uVar10 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 0xe);
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 0xc) =
         *(undefined8 *)((newDelta->m_backend).data._M_elems + 0xc);
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 0xe) = uVar10;
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 8) = uVar8;
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 10) = uVar9;
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 4) = uVar6;
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 6) = uVar7;
    *(undefined8 *)(this->delta).m_backend.data._M_elems = uVar4;
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 2) = uVar5;
    (this->delta).m_backend.exp = (newDelta->m_backend).exp;
    (this->delta).m_backend.neg = (newDelta->m_backend).neg;
    iVar11 = (newDelta->m_backend).prec_elem;
    (this->delta).m_backend.fpclass = (newDelta->m_backend).fpclass;
    (this->delta).m_backend.prec_elem = iVar11;
  }
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         delta = this->tolerances()->epsilon();
      else
         delta = newDelta;
   }